

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O1

LLVMValueRef CompileLlvmIntegerLiteral(LlvmCompilationContext *ctx,ExprIntegerLiteral *node)

{
  ExpressionContext *pEVar1;
  LLVMValueRef pLVar2;
  long lVar3;
  TypeBase *type;
  
  type = (node->super_ExprBase).type;
  pEVar1 = ctx->ctx;
  lVar3 = 0x89d8;
  if (((pEVar1->typeBool != type) && (pEVar1->typeChar != type)) && (pEVar1->typeShort != type)) {
    if (pEVar1->typeFloat != type) goto LAB_00184ebd;
    lVar3 = 0x89f0;
  }
  type = *(TypeBase **)((long)(pEVar1->uniqueDependencies).little + lVar3 + -0x30);
LAB_00184ebd:
  CompileLlvmType(ctx,type);
  pLVar2 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)&placeholderValue);
  return pLVar2;
}

Assistant:

LLVMValueRef CompileLlvmIntegerLiteral(LlvmCompilationContext &ctx, ExprIntegerLiteral *node)
{
	return CheckType(ctx, node, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->type)), node->value, true));
}